

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase583::run(TestCase583 *this)

{
  PathPtr fromPath;
  PathPtr toPath;
  String *pSVar1;
  size_t sVar2;
  char *pcVar3;
  ReadableFile *pRVar4;
  undefined8 uVar5;
  int iVar6;
  undefined4 extraout_var;
  char *ptrCopy;
  bool bVar7;
  StringPtr name;
  PathPtr path;
  StringPtr text;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  PathPtr path_00;
  StringPtr name_03;
  PathPtr path_01;
  StringPtr text_00;
  StringPtr name_04;
  PathPtr path_02;
  StringPtr name_05;
  StringPtr text_01;
  StringPtr name_06;
  PathPtr path_03;
  StringPtr name_07;
  PathPtr path_04;
  Own<kj::Directory::Replacer<kj::File>_> replacer;
  Own<kj::Directory> src;
  Own<kj::Directory> dst;
  TempDir tempDirDst;
  TempDir tempDirSrc;
  Path local_c8;
  String local_a8;
  FsNode local_90;
  ReadableFile *local_88;
  undefined1 local_80 [24];
  String *local_68;
  TempDir local_60;
  TempDir local_48;
  String *local_30;
  File *pFStack_28;
  
  TempDir::TempDir(&local_48);
  TempDir::TempDir(&local_60);
  TempDir::get((TempDir *)local_80);
  TempDir::get((TempDir *)(local_80 + 0x10));
  uVar5 = local_80._8_8_;
  name.content.size_ = 4;
  name.content.ptr = "foo";
  Path::Path((Path *)&local_a8,name);
  path.parts.size_ = (size_t)local_a8.content.ptr;
  path.parts.ptr = (String *)uVar5;
  Directory::openFile((Directory *)&local_c8,path,(WriteMode)local_a8.content.size_);
  text.content.size_ = 7;
  text.content.ptr = "foobar";
  File::writeAll((File *)local_c8.parts.size_,text);
  sVar2 = local_c8.parts.size_;
  if ((File *)local_c8.parts.size_ != (File *)0x0) {
    local_c8.parts.size_ = 0;
    (**(code **)((local_c8.parts.ptr)->content).ptr)
              (local_c8.parts.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_a8.content.size_;
  pcVar3 = local_a8.content.ptr;
  if ((String *)local_a8.content.ptr != (String *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  pSVar1 = local_68;
  name_00.content.size_ = 5;
  name_00.content.ptr = "link";
  Path::Path((Path *)&local_a8,name_00);
  uVar5 = local_80._8_8_;
  toPath.parts.size_ = local_a8.content.size_;
  toPath.parts.ptr = (String *)local_a8.content.ptr;
  name_01.content.size_ = 4;
  name_01.content.ptr = "foo";
  Path::Path(&local_c8,name_01);
  local_30 = local_c8.parts.ptr;
  pFStack_28 = (File *)local_c8.parts.size_;
  fromPath.parts.size_ = local_c8.parts.size_;
  fromPath.parts.ptr = local_c8.parts.ptr;
  Directory::transfer((Directory *)pSVar1,toPath,CREATE,(Directory *)uVar5,fromPath,LINK);
  sVar2 = local_c8.parts.size_;
  pSVar1 = local_c8.parts.ptr;
  if (local_c8.parts.ptr != (String *)0x0) {
    local_c8.parts.ptr = (String *)0x0;
    local_c8.parts.size_ = 0;
    (**(local_c8.parts.disposer)->_vptr_ArrayDisposer)
              (local_c8.parts.disposer,pSVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  sVar2 = local_a8.content.size_;
  pcVar3 = local_a8.content.ptr;
  if ((String *)local_a8.content.ptr != (String *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  pSVar1 = local_68;
  name_02.content.size_ = 5;
  name_02.content.ptr = "link";
  Path::Path(&local_c8,name_02);
  path_00.parts.size_ = (size_t)local_c8.parts.ptr;
  path_00.parts.ptr = pSVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_90,path_00);
  ReadableFile::readAllText(&local_a8,local_88);
  sVar2 = local_a8.content.size_;
  pcVar3 = local_a8.content.ptr;
  bVar7 = true;
  if (local_a8.content.size_ == 7) {
    bVar7 = *(short *)((long)&((Array<char> *)local_a8.content.ptr)->ptr + 4) != 0x7261 ||
            *(int *)&((Array<char> *)local_a8.content.ptr)->ptr != 0x626f6f66;
  }
  if ((String *)local_a8.content.ptr != (String *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar3,1,sVar2,sVar2,0);
  }
  pRVar4 = local_88;
  if (local_88 != (ReadableFile *)0x0) {
    local_88 = (ReadableFile *)0x0;
    (**(code **)*local_90._vptr_FsNode)
              (local_90._vptr_FsNode,
               (pRVar4->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar4->super_FsNode);
  }
  sVar2 = local_c8.parts.size_;
  pSVar1 = local_c8.parts.ptr;
  if (local_c8.parts.ptr != (String *)0x0) {
    local_c8.parts.ptr = (String *)0x0;
    local_c8.parts.size_ = 0;
    (**(local_c8.parts.disposer)->_vptr_ArrayDisposer)
              (local_c8.parts.disposer,pSVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((bool)(bVar7 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x253,ERROR,
               "\"failed: expected \" \"dst->openFile(Path(\\\"link\\\"))->readAllText() == \\\"foobar\\\"\""
               ,(char (*) [72])
                "failed: expected dst->openFile(Path(\"link\"))->readAllText() == \"foobar\"");
  }
  uVar5 = local_80._8_8_;
  name_03.content.size_ = 4;
  name_03.content.ptr = "foo";
  Path::Path((Path *)&local_a8,name_03);
  path_01.parts.size_ = (size_t)local_a8.content.ptr;
  path_01.parts.ptr = (String *)uVar5;
  Directory::openFile((Directory *)&local_c8,path_01,(WriteMode)local_a8.content.size_);
  text_00.content.size_ = 7;
  text_00.content.ptr = "bazqux";
  File::writeAll((File *)local_c8.parts.size_,text_00);
  sVar2 = local_c8.parts.size_;
  if ((File *)local_c8.parts.size_ != (File *)0x0) {
    local_c8.parts.size_ = 0;
    (**(code **)((local_c8.parts.ptr)->content).ptr)
              (local_c8.parts.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  sVar2 = local_a8.content.size_;
  pcVar3 = local_a8.content.ptr;
  if ((String *)local_a8.content.ptr != (String *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  pSVar1 = local_68;
  name_04.content.size_ = 5;
  name_04.content.ptr = "link";
  Path::Path(&local_c8,name_04);
  path_02.parts.size_ = (size_t)local_c8.parts.ptr;
  path_02.parts.ptr = pSVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_90,path_02);
  ReadableFile::readAllText(&local_a8,local_88);
  sVar2 = local_a8.content.size_;
  pcVar3 = local_a8.content.ptr;
  bVar7 = true;
  if (local_a8.content.size_ == 7) {
    bVar7 = *(short *)((long)&((Array<char> *)local_a8.content.ptr)->ptr + 4) != 0x7875 ||
            *(int *)&((Array<char> *)local_a8.content.ptr)->ptr != 0x717a6162;
  }
  if ((String *)local_a8.content.ptr != (String *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar3,1,sVar2,sVar2,0);
  }
  pRVar4 = local_88;
  if (local_88 != (ReadableFile *)0x0) {
    local_88 = (ReadableFile *)0x0;
    (**(code **)*local_90._vptr_FsNode)
              (local_90._vptr_FsNode,
               (pRVar4->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar4->super_FsNode);
  }
  sVar2 = local_c8.parts.size_;
  pSVar1 = local_c8.parts.ptr;
  if (local_c8.parts.ptr != (String *)0x0) {
    local_c8.parts.ptr = (String *)0x0;
    local_c8.parts.size_ = 0;
    (**(local_c8.parts.disposer)->_vptr_ArrayDisposer)
              (local_c8.parts.disposer,pSVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((bool)(bVar7 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,599,ERROR,
               "\"failed: expected \" \"dst->openFile(Path(\\\"link\\\"))->readAllText() == \\\"bazqux\\\"\""
               ,(char (*) [72])
                "failed: expected dst->openFile(Path(\"link\"))->readAllText() == \"bazqux\"");
  }
  uVar5 = local_80._8_8_;
  name_05.content.size_ = 4;
  name_05.content.ptr = "foo";
  Path::Path((Path *)&local_a8,name_05);
  (**(code **)(((Array<char> *)uVar5)->ptr + 0x70))
            (&local_c8,uVar5,local_a8.content.ptr,local_a8.content.size_,2);
  sVar2 = local_a8.content.size_;
  pcVar3 = local_a8.content.ptr;
  if ((String *)local_a8.content.ptr != (String *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar3,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  iVar6 = (**(((ReadableFile *)local_c8.parts.size_)->super_FsNode)._vptr_FsNode)();
  text_01.content.size_ = 6;
  text_01.content.ptr = "corge";
  File::writeAll((File *)CONCAT44(extraout_var,iVar6),text_01);
  sVar2 = local_c8.parts.size_;
  iVar6 = (*(((ReadableFile *)local_c8.parts.size_)->super_FsNode)._vptr_FsNode[1])
                    (local_c8.parts.size_);
  if ((char)iVar6 == '\0') {
    Directory::commitFailed
              (*(WriteMode *)&(((File *)(sVar2 + 8))->super_ReadableFile).super_FsNode._vptr_FsNode)
    ;
  }
  sVar2 = local_c8.parts.size_;
  if ((File *)local_c8.parts.size_ != (File *)0x0) {
    local_c8.parts.size_ = 0;
    (**(code **)((local_c8.parts.ptr)->content).ptr)
              (local_c8.parts.ptr,
               (((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode[-2] +
               (long)&(((ReadableFile *)sVar2)->super_FsNode)._vptr_FsNode);
  }
  uVar5 = local_80._8_8_;
  name_06.content.size_ = 4;
  name_06.content.ptr = "foo";
  Path::Path(&local_c8,name_06);
  path_03.parts.size_ = (size_t)local_c8.parts.ptr;
  path_03.parts.ptr = (String *)uVar5;
  ReadableDirectory::openFile((ReadableDirectory *)&local_90,path_03);
  ReadableFile::readAllText(&local_a8,local_88);
  sVar2 = local_a8.content.size_;
  pcVar3 = local_a8.content.ptr;
  bVar7 = true;
  if (local_a8.content.size_ == 6) {
    bVar7 = *(char *)((long)&((Array<char> *)local_a8.content.ptr)->ptr + 4) != 'e' ||
            *(int *)&((Array<char> *)local_a8.content.ptr)->ptr != 0x67726f63;
  }
  if ((String *)local_a8.content.ptr != (String *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar3,1,sVar2,sVar2,0);
  }
  pRVar4 = local_88;
  if (local_88 != (ReadableFile *)0x0) {
    local_88 = (ReadableFile *)0x0;
    (**(code **)*local_90._vptr_FsNode)
              (local_90._vptr_FsNode,
               (pRVar4->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar4->super_FsNode);
  }
  sVar2 = local_c8.parts.size_;
  pSVar1 = local_c8.parts.ptr;
  if (local_c8.parts.ptr != (String *)0x0) {
    local_c8.parts.ptr = (String *)0x0;
    local_c8.parts.size_ = 0;
    (**(local_c8.parts.disposer)->_vptr_ArrayDisposer)
              (local_c8.parts.disposer,pSVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((bool)(bVar7 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[70]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x25f,ERROR,
               "\"failed: expected \" \"src->openFile(Path(\\\"foo\\\"))->readAllText() == \\\"corge\\\"\""
               ,(char (*) [70])
                "failed: expected src->openFile(Path(\"foo\"))->readAllText() == \"corge\"");
  }
  pSVar1 = local_68;
  name_07.content.size_ = 5;
  name_07.content.ptr = "link";
  Path::Path(&local_c8,name_07);
  path_04.parts.size_ = (size_t)local_c8.parts.ptr;
  path_04.parts.ptr = pSVar1;
  ReadableDirectory::openFile((ReadableDirectory *)&local_90,path_04);
  ReadableFile::readAllText(&local_a8,local_88);
  sVar2 = local_a8.content.size_;
  pcVar3 = local_a8.content.ptr;
  bVar7 = true;
  if (local_a8.content.size_ == 7) {
    bVar7 = *(short *)((long)&((Array<char> *)local_a8.content.ptr)->ptr + 4) != 0x7875 ||
            *(int *)&((Array<char> *)local_a8.content.ptr)->ptr != 0x717a6162;
  }
  if ((String *)local_a8.content.ptr != (String *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar3,1,sVar2,sVar2,0);
  }
  pRVar4 = local_88;
  if (local_88 != (ReadableFile *)0x0) {
    local_88 = (ReadableFile *)0x0;
    (**(code **)*local_90._vptr_FsNode)
              (local_90._vptr_FsNode,
               (pRVar4->super_FsNode)._vptr_FsNode[-2] + (long)&pRVar4->super_FsNode);
  }
  sVar2 = local_c8.parts.size_;
  pSVar1 = local_c8.parts.ptr;
  if (local_c8.parts.ptr != (String *)0x0) {
    local_c8.parts.ptr = (String *)0x0;
    local_c8.parts.size_ = 0;
    (**(local_c8.parts.disposer)->_vptr_ArrayDisposer)
              (local_c8.parts.disposer,pSVar1,0x18,sVar2,sVar2,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  if ((bool)(bVar7 & _::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[72]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
               ,0x260,ERROR,
               "\"failed: expected \" \"dst->openFile(Path(\\\"link\\\"))->readAllText() == \\\"bazqux\\\"\""
               ,(char (*) [72])
                "failed: expected dst->openFile(Path(\"link\"))->readAllText() == \"bazqux\"");
  }
  pSVar1 = local_68;
  if (local_68 != (String *)0x0) {
    local_68 = (String *)0x0;
    (***(_func_int ***)local_80._16_8_)
              (local_80._16_8_,
               (long)&(pSVar1->content).ptr + *(long *)((pSVar1->content).ptr + -0x10));
  }
  uVar5 = local_80._8_8_;
  if ((String *)local_80._8_8_ != (String *)0x0) {
    local_80._8_8_ = (String *)0x0;
    (*(code *)**(undefined8 **)local_80._0_8_)
              (local_80._0_8_,
               (long)&((Array<char> *)uVar5)->ptr + *(long *)(((Array<char> *)uVar5)->ptr + -0x10));
  }
  TempDir::~TempDir(&local_60);
  TempDir::~TempDir(&local_48);
  return;
}

Assistant:

TEST(Async, Canceler) {
  EventLoop loop;
  WaitScope waitScope(loop);
  Canceler canceler;

  auto never = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE));
  auto now = canceler.wrap(kj::Promise<void>(kj::READY_NOW));
  auto neverI = canceler.wrap(kj::Promise<void>(kj::NEVER_DONE).then([]() { return 123u; }));
  auto nowI = canceler.wrap(kj::Promise<uint>(123u));

  KJ_EXPECT(!never.poll(waitScope));
  KJ_EXPECT(now.poll(waitScope));
  KJ_EXPECT(!neverI.poll(waitScope));
  KJ_EXPECT(nowI.poll(waitScope));

  canceler.cancel("foobar");

  KJ_EXPECT_THROW_RECOVERABLE_MESSAGE("foobar", never.wait(waitScope));
  now.wait(waitScope);
  KJ_EXPECT_THROW_MESSAGE("foobar", neverI.wait(waitScope));
  KJ_EXPECT(nowI.wait(waitScope) == 123u);
}